

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.h
# Opt level: O0

void __thiscall bandit::reporter::info::output_not_yet_shown_context_start_messages(info *this)

{
  reference pvVar1;
  int local_78;
  int i_1;
  int local_64;
  undefined1 local_60 [4];
  int i;
  stack<bandit::reporter::info::context_info,_std::deque<bandit::reporter::info::context_info,_std::allocator<bandit::reporter::info::context_info>_>_>
  temp_stack;
  info *this_local;
  
  temp_stack.c.
  super__Deque_base<bandit::reporter::info::context_info,_std::allocator<bandit::reporter::info::context_info>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)this;
  std::
  stack<bandit::reporter::info::context_info,std::deque<bandit::reporter::info::context_info,std::allocator<bandit::reporter::info::context_info>>>
  ::
  stack<std::deque<bandit::reporter::info::context_info,std::allocator<bandit::reporter::info::context_info>>,void>
            ((stack<bandit::reporter::info::context_info,std::deque<bandit::reporter::info::context_info,std::allocator<bandit::reporter::info::context_info>>>
              *)local_60);
  for (local_64 = 0; local_64 < this->not_yet_shown_; local_64 = local_64 + 1) {
    pvVar1 = std::
             stack<bandit::reporter::info::context_info,_std::deque<bandit::reporter::info::context_info,_std::allocator<bandit::reporter::info::context_info>_>_>
             ::top(&this->context_stack_);
    std::
    stack<bandit::reporter::info::context_info,_std::deque<bandit::reporter::info::context_info,_std::allocator<bandit::reporter::info::context_info>_>_>
    ::push((stack<bandit::reporter::info::context_info,_std::deque<bandit::reporter::info::context_info,_std::allocator<bandit::reporter::info::context_info>_>_>
            *)local_60,pvVar1);
    std::
    stack<bandit::reporter::info::context_info,_std::deque<bandit::reporter::info::context_info,_std::allocator<bandit::reporter::info::context_info>_>_>
    ::pop(&this->context_stack_);
  }
  for (local_78 = 0; local_78 < this->not_yet_shown_; local_78 = local_78 + 1) {
    pvVar1 = std::
             stack<bandit::reporter::info::context_info,_std::deque<bandit::reporter::info::context_info,_std::allocator<bandit::reporter::info::context_info>_>_>
             ::top((stack<bandit::reporter::info::context_info,_std::deque<bandit::reporter::info::context_info,_std::allocator<bandit::reporter::info::context_info>_>_>
                    *)local_60);
    std::
    stack<bandit::reporter::info::context_info,_std::deque<bandit::reporter::info::context_info,_std::allocator<bandit::reporter::info::context_info>_>_>
    ::push(&this->context_stack_,pvVar1);
    output_context_start_message(this);
    std::
    stack<bandit::reporter::info::context_info,_std::deque<bandit::reporter::info::context_info,_std::allocator<bandit::reporter::info::context_info>_>_>
    ::pop((stack<bandit::reporter::info::context_info,_std::deque<bandit::reporter::info::context_info,_std::allocator<bandit::reporter::info::context_info>_>_>
           *)local_60);
  }
  this->not_yet_shown_ = 0;
  std::
  stack<bandit::reporter::info::context_info,_std::deque<bandit::reporter::info::context_info,_std::allocator<bandit::reporter::info::context_info>_>_>
  ::~stack((stack<bandit::reporter::info::context_info,_std::deque<bandit::reporter::info::context_info,_std::allocator<bandit::reporter::info::context_info>_>_>
            *)local_60);
  return;
}

Assistant:

void output_not_yet_shown_context_start_messages() {
        std::stack<context_info> temp_stack;
        for (int i = 0; i < not_yet_shown_; ++i) {
          temp_stack.push(context_stack_.top());
          context_stack_.pop();
        }
        for (int i = 0; i < not_yet_shown_; ++i) {
          context_stack_.push(temp_stack.top());
          output_context_start_message();
          temp_stack.pop();
        }
        not_yet_shown_ = 0;
      }